

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

time_ms_t __thiscall Container::get_time_usage_ms(Container *this)

{
  int iVar1;
  CgroupController *pCVar2;
  _Alloc_hider __nptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  longlong lVar4;
  undefined8 uVar5;
  size_t in_RCX;
  string data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pCVar2 = this->cpuacct_controller_;
  local_68[0] = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"cpuacct.usage","");
  CgroupController::read((CgroupController *)&local_48,(int)pCVar2,local_68,in_RCX);
  if (local_68[0] != &local_58) {
    operator_delete(local_68[0],local_58._M_allocated_capacity + 1);
  }
  __nptr._M_p = local_48._M_p;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)__errno_location();
  iVar1 = *(int *)paVar3;
  *(int *)paVar3 = 0;
  lVar4 = strtoll(__nptr._M_p,(char **)local_68,10);
  if (local_68[0] ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__nptr._M_p) {
    uVar5 = std::__throw_invalid_argument("stoll");
    if (local_68[0] != paVar3) {
      operator_delete(local_68[0],local_58._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar5);
  }
  if (*(int *)paVar3 != 0) {
    if (*(int *)paVar3 != 0x22) goto LAB_00119814;
    std::__throw_out_of_range("stoll");
  }
  *(int *)paVar3 = iVar1;
LAB_00119814:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  return lVar4 / 1000000;
}

Assistant:

time_ms_t Container::get_time_usage_ms() {
    std::string data = cpuacct_controller_->read("cpuacct.usage");
    return stoll(data) / 1000000;
}